

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

NULLCArray __thiscall
NULLCMemory::read_long_array(NULLCMemory *this,NULLCArray buffer,int offset,int elements)

{
  uint uVar1;
  uint uVar2;
  char *error;
  NULLCArray NVar3;
  
  uVar1 = buffer.len;
  if (this == (NULLCMemory *)0x0) {
    error = "buffer is empty";
  }
  else if ((int)uVar1 < 0) {
    error = "offset is negative";
  }
  else if (offset < 0) {
    error = "element count is negative";
  }
  else {
    error = "buffer overflow";
    uVar2 = (uint)buffer.ptr - uVar1;
    if ((uVar1 <= (uint)buffer.ptr && uVar2 != 0) && ((uint)offset <= uVar2 >> 3)) {
      NVar3 = nullcAllocateArrayTyped(5,offset);
      memcpy(NVar3.ptr,this + uVar1,(ulong)(uint)offset << 3);
      return NVar3;
    }
  }
  nullcThrowError(error);
  return (NULLCArray)ZEXT812(0);
}

Assistant:

bool check_access(NULLCArray buffer, int offset, unsigned readSizeLog2, int elements)
	{
		if(!buffer.ptr)
		{
			nullcThrowError("buffer is empty");
			return false;
		}

		if(offset < 0)
		{
			nullcThrowError("offset is negative");
			return false;
		}

		if(elements < 0)
		{
			nullcThrowError("element count is negative");
			return false;
		}

		if(unsigned(offset) >= buffer.len)
		{
			nullcThrowError("buffer overflow");
			return false;
		}

		unsigned availableElements = ((buffer.len - offset) >> readSizeLog2);

		if(unsigned(elements) > availableElements)
		{
			nullcThrowError("buffer overflow");
			return false;
		}